

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O0

bool anon_unknown.dwarf_178f1b::checkSampleCount
               (Array2D<unsigned_int> *sampleCount,int x1,int x2,int y1,int y2,int width)

{
  uint *puVar1;
  ostream *poVar2;
  void *pvVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  Array2D<unsigned_int> *in_RDI;
  int in_R8D;
  int in_R9D;
  int j;
  int i;
  int local_2c;
  int local_28;
  
  local_28 = in_ECX;
  do {
    local_2c = in_ESI;
    if (in_R8D < local_28) {
      return true;
    }
    for (; local_2c <= in_EDX; local_2c = local_2c + 1) {
      puVar1 = Imf_3_4::Array2D<unsigned_int>::operator[](in_RDI,(long)local_28);
      if (puVar1[local_2c] != (local_28 * in_R9D + local_2c) % 10 + 1U) {
        poVar2 = std::operator<<((ostream *)&std::cout,"sample count at ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_2c);
        poVar2 = std::operator<<(poVar2,", ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28);
        poVar2 = std::operator<<(poVar2,": ");
        puVar1 = Imf_3_4::Array2D<unsigned_int>::operator[](in_RDI,(long)local_28);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,puVar1[local_2c]);
        poVar2 = std::operator<<(poVar2,", should be ");
        pvVar3 = (void *)std::ostream::operator<<(poVar2,(local_28 * in_R9D + local_2c) % 10 + 1);
        pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(pvVar3,std::flush<char,std::char_traits<char>>);
        return false;
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

bool
checkSampleCount (
    Array2D<unsigned int>& sampleCount,
    int                    x1,
    int                    x2,
    int                    y1,
    int                    y2,
    int                    width)
{
    for (int i = y1; i <= y2; i++)
        for (int j = x1; j <= x2; j++)
        {
            if (sampleCount[i][j] !=
                static_cast<unsigned int> (((i * width) + j) % 10 + 1))
            {
                cout << "sample count at " << j << ", " << i << ": "
                     << sampleCount[i][j] << ", should be "
                     << (i * width + j) % 10 + 1 << endl
                     << flush;
                return false;
            }
        }
    return true;
}